

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::OP_ProfiledStrictLdThis
          (InterpreterStackFrame *this,Var thisVar,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  DynamicProfileInfo *this_00;
  undefined4 *puVar5;
  RecyclableObject *this_01;
  char *message;
  ThisType thisType;
  char *error;
  uint lineNumber;
  char *fileName;
  
  this_00 = FunctionBody::GetDynamicProfileInfo(*(FunctionBody **)(this + 0x88));
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a476a4;
    *puVar5 = 0;
LAB_00a47596:
    this_01 = UnsafeVarTo<Js::RecyclableObject>(thisVar);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a476a4;
      *puVar5 = 0;
    }
    TVar1 = ((this_01->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_ActivationObject) {
        thisVar = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
        thisType = ThisType_Mapped;
        goto LAB_00a4768d;
      }
    }
    else {
      BVar4 = RecyclableObject::IsExternal(this_01);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        fileName = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        error = "(typeId < TypeIds_Limit || obj->IsExternal())";
        message = "GetTypeId aValue has invalid TypeId";
        lineNumber = 0xe;
        goto LAB_00a47672;
      }
    }
  }
  else if (((ulong)thisVar & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)thisVar >> 0x32 == 0 && ((ulong)thisVar & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00a47596;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    error = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    message = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    lineNumber = 0x2a;
LAB_00a47672:
    bVar3 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar3) {
LAB_00a476a4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  thisType = ThisType_Simple;
LAB_00a4768d:
  DynamicProfileInfo::RecordThisInfo(this_00,thisVar,thisType);
  return (RecyclableObject *)thisVar;
}

Assistant:

Var InterpreterStackFrame::OP_ProfiledStrictLdThis(Var thisVar, ScriptContext* scriptContext)
    {
        FunctionBody * functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        if (typeId == TypeIds_ActivationObject)
        {
            thisVar = scriptContext->GetLibrary()->GetUndefined();
            dynamicProfileInfo->RecordThisInfo(thisVar, ThisType_Mapped);
            return thisVar;
        }

        dynamicProfileInfo->RecordThisInfo(thisVar, ThisType_Simple);
        return thisVar;
    }